

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tbl.hpp
# Opt level: O1

bool __thiscall
Tbl::Table<std::allocator<char>_>::ReadRow
          (Table<std::allocator<char>_> *this,string_view text,const_iterator *current,
          char delimiter,Format format)

{
  char *pcVar1;
  size_type sVar2;
  string_view text_00;
  bool bVar3;
  char *pcVar4;
  size_type sVar5;
  String str;
  __hashtable *__h;
  anon_class_1_0_00000001 local_99;
  Format local_98;
  int local_94;
  long *local_90 [2];
  long local_80 [2];
  ulong local_70;
  String local_68;
  _Hashtable<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_48;
  size_t local_40;
  char *local_38;
  
  local_38 = text._M_str;
  local_40 = text._M_len;
  pcVar1 = local_38 + local_40;
  local_48 = (_Hashtable<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->m_rowMap;
  sVar5 = 0;
  local_94 = (int)delimiter;
  local_98 = format;
  do {
    if (*current == pcVar1) break;
    text_00._M_str = local_38;
    text_00._M_len = local_40;
    Table<std::allocator<char>>::ParseCell_abi_cxx11_
              (&local_68,(Table<std::allocator<char>> *)this,text_00,(char)local_94,current);
    if (sVar5 == 0) {
      sVar2 = (this->m_rowMap)._M_h._M_element_count;
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,local_68._M_dataplus._M_p,
                 local_68._M_dataplus._M_p + local_68._M_string_length);
      local_70 = sVar2;
      std::
      _Hashtable<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<std::__cxx11::string_const,unsigned_long>>(local_48,(string *)local_90)
      ;
      if (local_90[0] != local_80) {
        operator_delete(local_90[0],local_80[0] + 1);
      }
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,local_68._M_dataplus._M_p,
                 local_68._M_dataplus._M_p + local_68._M_string_length);
      local_70 = CONCAT71(local_70._1_7_,2);
      std::
      vector<std::variant<long,double,std::__cxx11::string>,std::allocator<std::variant<long,double,std::__cxx11::string>>>
      ::emplace_back<std::variant<long,double,std::__cxx11::string>>
                ((vector<std::variant<long,double,std::__cxx11::string>,std::allocator<std::variant<long,double,std::__cxx11::string>>>
                  *)this,(variant<long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_90);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[local_70 & 0xff]._M_data)
                (&local_99,
                 (variant<long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_90);
    }
    else {
      ParseData((TableData *)local_90,this,&local_68,local_98);
      std::
      vector<std::variant<long,double,std::__cxx11::string>,std::allocator<std::variant<long,double,std::__cxx11::string>>>
      ::emplace_back<std::variant<long,double,std::__cxx11::string>>
                ((vector<std::variant<long,double,std::__cxx11::string>,std::allocator<std::variant<long,double,std::__cxx11::string>>>
                  *)this,(variant<long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_90);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[local_70 & 0xff]._M_data)
                (&local_99,
                 (variant<long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_90);
    }
    pcVar4 = *current;
    if (pcVar4 == pcVar1) {
      bVar3 = false;
    }
    else {
      bVar3 = false;
      if ((*pcVar4 != '\n') && (bVar3 = false, *pcVar4 != '\r')) {
        *current = pcVar4 + 1;
        bVar3 = true;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    sVar5 = sVar5 + 1;
  } while (bVar3);
  pcVar4 = *current;
  while ((pcVar4 != pcVar1 && ((*pcVar4 == '\r' || (*pcVar4 == '\n'))))) {
    pcVar4 = pcVar4 + 1;
    *current = pcVar4;
  }
  return sVar5 == (this->m_columnMap)._M_h._M_element_count;
}

Assistant:

bool ReadRow(std::string_view text, std::string_view::const_iterator & current, char delimiter, Format format)
		{
			// Track column data
			size_t column = 0;
			while (current != text.end())
			{
				auto str = ParseCell(text, delimiter, current);
				if (column == 0)
				{
					m_rowMap.insert({ str, m_rowMap.size() });
					m_tableData.push_back(str);
				}
				else
					m_tableData.push_back(ParseData(str, format));
				++column;
				if (current == text.end() || IsLineEnd(current))
					break;
				++current;
			}
			AdvanceToNextLine(text, current);
			return column == GetNumColumns();
		}